

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

array_type * __thiscall
toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>::as_array
          (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this)

{
  value_type *pvVar1;
  allocator<char> local_31;
  string local_30;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *local_10;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *this_local;
  
  local_10 = this;
  if (this->type_ != array) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"toml::value::as_array(): ",&local_31);
    detail::
    throw_bad_cast<(toml::value_t)9,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
              (&local_30,this->type_,this);
  }
  pvVar1 = detail::
           storage<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
           ::value((storage<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>
                    *)&(this->field_1).string_);
  return pvVar1;
}

Assistant:

array_type const& as_array() const&
    {
        if(this->type_ != value_t::array)
        {
            detail::throw_bad_cast<value_t::array>(
                    "toml::value::as_array(): ", this->type_, *this);
        }
        return this->array_.value();
    }